

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

string * __thiscall
pbrt::FilterHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,FilterHandle *this)

{
  ulong uVar1;
  uint uVar2;
  GaussianFilter *this_00;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          ).bits;
  this_00 = (GaussianFilter *)(uVar1 & 0xffffffffffff);
  if (this_00 == (GaussianFilter *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(nullptr)","")
    ;
  }
  else {
    uVar2 = (uint)(ushort)(uVar1 >> 0x30);
    if (uVar1 >> 0x30 < 3) {
      if (uVar2 == 2) {
        GaussianFilter::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
      else {
        BoxFilter::ToString_abi_cxx11_(__return_storage_ptr__,(BoxFilter *)this_00);
      }
    }
    else {
      uVar2 = uVar2 - 2;
      if (uVar2 < 2) {
        MitchellFilter::ToString_abi_cxx11_(__return_storage_ptr__,(MitchellFilter *)this_00);
      }
      else if (uVar2 == 2) {
        LanczosSincFilter::ToString_abi_cxx11_(__return_storage_ptr__,(LanczosSincFilter *)this_00);
      }
      else {
        TriangleFilter::ToString_abi_cxx11_(__return_storage_ptr__,(TriangleFilter *)this_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilterHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}